

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O0

void __thiscall libtorrent::settings_pack::clear(settings_pack *this,int name)

{
  bool bVar1;
  uint uVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  bool bVar6;
  const_iterator local_118;
  __normal_iterator<std::pair<unsigned_short,_bool>_*,_std::vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>_>
  local_110;
  pair<unsigned_short,_bool> *local_108;
  __normal_iterator<std::pair<unsigned_short,_bool>_*,_std::vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>_>
  local_100;
  __normal_iterator<std::pair<unsigned_short,_bool>_*,_std::vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>_>
  local_f8;
  __normal_iterator<std::pair<unsigned_short,_bool>_*,_std::vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>_>
  i_2;
  pair<unsigned_short,_bool> v_2;
  const_iterator local_e0;
  __normal_iterator<std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
  local_d8;
  pair<unsigned_short,_int> *local_d0;
  __normal_iterator<std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
  local_c8;
  __normal_iterator<std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
  local_c0;
  __normal_iterator<std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
  i_1;
  pair<unsigned_short,_int> local_b0;
  pair<unsigned_short,_int> v_1;
  const_iterator local_a0;
  __normal_iterator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_98;
  pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_90;
  __normal_iterator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_88;
  __normal_iterator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_80;
  __normal_iterator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  unsigned_short local_42;
  undefined1 local_40 [8];
  pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  int name_local;
  settings_pack *this_local;
  
  uVar2 = name & 0xc000;
  v.second.field_2._12_4_ = name;
  if (uVar2 == 0) {
    local_42 = libtorrent::aux::numeric_cast<unsigned_short,int,void>(name);
    ::std::__cxx11::string::string((string *)&local_68);
    ::std::
    pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_40,&local_42,&local_68);
    ::std::__cxx11::string::~string((string *)&local_68);
    local_88._M_current =
         (pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)::std::
            vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::begin(&this->m_strings);
    local_90 = (pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)::std::
                  vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::end(&this->m_strings);
    local_80 = ::std::
               lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_short,std::__cxx11::string>*,std::vector<std::pair<unsigned_short,std::__cxx11::string>,std::allocator<std::pair<unsigned_short,std::__cxx11::string>>>>,std::pair<unsigned_short,std::__cxx11::string>,bool(*)(std::pair<unsigned_short,std::__cxx11::string>const&,std::pair<unsigned_short,std::__cxx11::string>const&)>
                         (local_88,(__normal_iterator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    )local_90,
                          (pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_40,::(anonymous_namespace)::compare_first<std::__cxx11::string>);
    local_98._M_current =
         (pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)::std::
            vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end(&this->m_strings);
    bVar1 = __gnu_cxx::operator!=(&local_80,&local_98);
    bVar6 = false;
    if (bVar1) {
      ppVar3 = __gnu_cxx::
               __normal_iterator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->(&local_80);
      bVar6 = (uint)ppVar3->first == v.second.field_2._12_4_;
    }
    if (bVar6) {
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_short,std::__cxx11::string>const*,std::vector<std::pair<unsigned_short,std::__cxx11::string>,std::allocator<std::pair<unsigned_short,std::__cxx11::string>>>>
      ::__normal_iterator<std::pair<unsigned_short,std::__cxx11::string>*>
                ((__normal_iterator<std::pair<unsigned_short,std::__cxx11::string>const*,std::vector<std::pair<unsigned_short,std::__cxx11::string>,std::allocator<std::pair<unsigned_short,std::__cxx11::string>>>>
                  *)&local_a0,&local_80);
      v_1 = (pair<unsigned_short,_int>)
            ::std::
            vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::erase(&this->m_strings,local_a0);
    }
    ::std::
    pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_40);
  }
  else if (uVar2 == 0x4000) {
    i_1._M_current._6_2_ = libtorrent::aux::numeric_cast<unsigned_short,int,void>(name);
    i_1._M_current._0_4_ = 0;
    ::std::pair<unsigned_short,_int>::pair<unsigned_short,_int,_true>
              (&local_b0,(unsigned_short *)((long)&i_1._M_current + 6),(int *)&i_1);
    local_c8._M_current =
         (pair<unsigned_short,_int> *)
         ::std::
         vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>::
         begin(&this->m_ints);
    local_d0 = (pair<unsigned_short,_int> *)
               ::std::
               vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
               ::end(&this->m_ints);
    local_c0 = ::std::
               lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_short,int>*,std::vector<std::pair<unsigned_short,int>,std::allocator<std::pair<unsigned_short,int>>>>,std::pair<unsigned_short,int>,bool(*)(std::pair<unsigned_short,int>const&,std::pair<unsigned_short,int>const&)>
                         (local_c8,(__normal_iterator<std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
                                    )local_d0,&local_b0,
                          anon_unknown.dwarf_c13c2b::compare_first<int>);
    local_d8._M_current =
         (pair<unsigned_short,_int> *)
         ::std::
         vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>::
         end(&this->m_ints);
    bVar1 = __gnu_cxx::operator!=(&local_c0,&local_d8);
    bVar6 = false;
    if (bVar1) {
      ppVar4 = __gnu_cxx::
               __normal_iterator<std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
               ::operator->(&local_c0);
      bVar6 = (uint)ppVar4->first == v.second.field_2._12_4_;
    }
    if (bVar6) {
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_short,int>const*,std::vector<std::pair<unsigned_short,int>,std::allocator<std::pair<unsigned_short,int>>>>
      ::__normal_iterator<std::pair<unsigned_short,int>*>
                ((__normal_iterator<std::pair<unsigned_short,int>const*,std::vector<std::pair<unsigned_short,int>,std::allocator<std::pair<unsigned_short,int>>>>
                  *)&local_e0,&local_c0);
      ::std::
      vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>::
      erase(&this->m_ints,local_e0);
    }
  }
  else if (uVar2 == 0x8000) {
    i_2._M_current._2_2_ = libtorrent::aux::numeric_cast<unsigned_short,int,void>(name);
    i_2._M_current._1_1_ = 0;
    ::std::pair<unsigned_short,_bool>::pair<unsigned_short,_bool,_true>
              ((pair<unsigned_short,_bool> *)((long)&i_2._M_current + 4),
               (unsigned_short *)((long)&i_2._M_current + 2),(bool *)((long)&i_2._M_current + 1));
    local_100._M_current =
         (pair<unsigned_short,_bool> *)
         ::std::
         vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
         ::begin(&this->m_bools);
    local_108 = (pair<unsigned_short,_bool> *)
                ::std::
                vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                ::end(&this->m_bools);
    local_f8 = ::std::
               lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_short,bool>*,std::vector<std::pair<unsigned_short,bool>,std::allocator<std::pair<unsigned_short,bool>>>>,std::pair<unsigned_short,bool>,bool(*)(std::pair<unsigned_short,bool>const&,std::pair<unsigned_short,bool>const&)>
                         (local_100,
                          (__normal_iterator<std::pair<unsigned_short,_bool>_*,_std::vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>_>
                           )local_108,(pair<unsigned_short,_bool> *)((long)&i_2._M_current + 4),
                          anon_unknown.dwarf_c13c2b::compare_first<bool>);
    local_110._M_current =
         (pair<unsigned_short,_bool> *)
         ::std::
         vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
         ::end(&this->m_bools);
    bVar1 = __gnu_cxx::operator!=(&local_f8,&local_110);
    bVar6 = false;
    if (bVar1) {
      ppVar5 = __gnu_cxx::
               __normal_iterator<std::pair<unsigned_short,_bool>_*,_std::vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>_>
               ::operator->(&local_f8);
      bVar6 = (uint)ppVar5->first == v.second.field_2._12_4_;
    }
    if (bVar6) {
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_short,bool>const*,std::vector<std::pair<unsigned_short,bool>,std::allocator<std::pair<unsigned_short,bool>>>>
      ::__normal_iterator<std::pair<unsigned_short,bool>*>
                ((__normal_iterator<std::pair<unsigned_short,bool>const*,std::vector<std::pair<unsigned_short,bool>,std::allocator<std::pair<unsigned_short,bool>>>>
                  *)&local_118,&local_f8);
      ::std::
      vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>::
      erase(&this->m_bools,local_118);
    }
  }
  return;
}

Assistant:

void settings_pack::clear(int const name)
	{
		switch (name & type_mask)
		{
			case string_type_base:
			{
				std::pair<std::uint16_t, std::string> v(aux::numeric_cast<std::uint16_t>(name), std::string());
				auto const i = std::lower_bound(m_strings.begin(), m_strings.end()
					, v, &compare_first<std::string>);
				if (i != m_strings.end() && i->first == name) m_strings.erase(i);
				break;
			}
			case int_type_base:
			{
				std::pair<std::uint16_t, int> v(aux::numeric_cast<std::uint16_t>(name), 0);
				auto const i = std::lower_bound(m_ints.begin(), m_ints.end()
					, v, &compare_first<int>);
				if (i != m_ints.end() && i->first == name) m_ints.erase(i);
				break;
			}
			case bool_type_base:
			{
				std::pair<std::uint16_t, bool> v(aux::numeric_cast<std::uint16_t>(name), false);
				auto const i = std::lower_bound(m_bools.begin(), m_bools.end()
					, v, &compare_first<bool>);
				if (i != m_bools.end() && i->first == name) m_bools.erase(i);
				break;
			}
		}
	}